

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_dup_i32_vec_ppc64(TCGContext_conflict10 *tcg_ctx,uint vece,TCGv_vec r,TCGv_i32 a)

{
  vec_gen_2_ppc64(tcg_ctx,INDEX_op_dup_vec,
                  (uint)(byte)((undefined1 *)((long)&tcg_ctx->pool_cur + 2))[(long)r],vece,
                  (TCGArg)(r + (long)&tcg_ctx->pool_cur),(TCGArg)(a + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_dup_i32_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_i32 a)
{
    TCGArg ri = tcgv_vec_arg(tcg_ctx, r);
    TCGArg ai = tcgv_i32_arg(tcg_ctx, a);
    TCGTemp *rt = arg_temp(ri);
    TCGType type = rt->base_type;

    vec_gen_2(tcg_ctx, INDEX_op_dup_vec, type, vece, ri, ai);
}